

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O2

void virtio_legacy_set_promiscuous(virtio_device *dev,_Bool on)

{
  undefined8 *puVar1;
  uint *puVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  pkt_buf *buf;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  int iVar9;
  char *__format;
  int iVar10;
  ushort uVar11;
  
  puVar4 = (uint *)dev->ctrl_queue;
  uVar11 = 0;
  uVar3 = *puVar4;
  while( true ) {
    if ((uVar3 <= uVar11) || (*(long *)(*(long *)(puVar4 + 2) + (ulong)uVar11 * 0x10) == 0)) break;
    uVar11 = uVar11 + 1;
  }
  if (uVar3 == uVar11) {
    __format = "[ERROR] %s:%d %s(): command queue full\n";
    uVar8 = 0x7b;
  }
  else {
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Found free desc slot at %u (%u)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x7d,"virtio_legacy_send_command",(ulong)(uint)uVar11,(ulong)uVar3);
    buf = pkt_buf_alloc(*(mempool **)(puVar4 + 0xc));
    if (buf == (pkt_buf *)0x0) {
      __format = "[ERROR] %s:%d %s(): Control queue ran out of buffers\n";
      uVar8 = 0x82;
    }
    else {
      *(uint *)&buf[1].buf_addr_phy = (uint)on << 0x10;
      *(pkt_buf **)(puVar4 + (ulong)uVar11 * 2 + 0xe) = buf;
      lVar6 = (ulong)uVar11 * 0x10;
      lVar5 = *(long *)(puVar4 + 2);
      *(undefined4 *)(lVar5 + 8 + lVar6) = 2;
      iVar10 = uVar11 + 1;
      *(uintptr_t *)(lVar5 + lVar6) = buf->buf_addr_phy + 0x40;
      *(undefined2 *)(lVar5 + 0xc + lVar6) = 1;
      *(short *)(lVar5 + 0xe + lVar6) = (short)iVar10;
      uVar7 = (ulong)(uint)(iVar10 * 0x10);
      *(undefined4 *)(lVar5 + 8 + uVar7) = 1;
      *(uintptr_t *)(lVar5 + uVar7) = buf->buf_addr_phy + 0x42;
      *(undefined2 *)(lVar5 + 0xc + uVar7) = 1;
      iVar9 = uVar11 + 2;
      *(short *)(lVar5 + 0xe + uVar7) = (short)iVar9;
      uVar7 = (ulong)(uint)(iVar9 * 0x10);
      *(undefined4 *)(lVar5 + 8 + uVar7) = 1;
      *(uintptr_t *)(lVar5 + uVar7) = buf->buf_addr_phy + 0x43;
      *(undefined4 *)(lVar5 + 0xc + uVar7) = 2;
      *(ushort *)
       (*(long *)(puVar4 + 4) + 4 +
       ((ulong)*(ushort *)(*(long *)(puVar4 + 4) + 2) % (ulong)*puVar4) * 2) = uVar11;
      *(short *)(*(long *)(puVar4 + 4) + 2) = *(short *)(*(long *)(puVar4 + 4) + 2) + 1;
      virtio_legacy_notify_queue(dev,2);
      while( true ) {
        lVar5 = *(long *)(puVar4 + 6);
        if ((short)puVar4[10] != *(short *)(lVar5 + 2)) break;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): Waiting...\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0xab,"virtio_legacy_send_command");
        usleep(100000);
      }
      *(short *)(puVar4 + 10) = (short)puVar4[10] + 1;
      puVar2 = (uint *)(lVar5 + 4 + (ulong)*(ushort *)(lVar5 + 2) * 8);
      fprintf(_stderr,"[DEBUG] %s:%d %s(): e %p: id %u len %u\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0xb1,"virtio_legacy_send_command",puVar2,(ulong)*puVar2,(ulong)puVar2[1]);
      if (*puVar2 == (uint)uVar11) {
        if (*(pkt_buf **)(puVar4 + (ulong)uVar11 * 2 + 0xe) == buf) {
          pkt_buf_free(buf);
          lVar5 = *(long *)(puVar4 + 2);
          puVar1 = (undefined8 *)(lVar5 + (ulong)uVar11 * 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)(lVar5 + (ulong)(uint)(iVar10 * 0x10));
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)(lVar5 + (ulong)(uint)(iVar9 * 0x10));
          *puVar1 = 0;
          puVar1[1] = 0;
          fprintf(_stdout,"[INFO ] %s:%d %s(): Set promisc to %u\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                  ,0xcb,"virtio_legacy_set_promiscuous",(ulong)on);
          return;
        }
        __format = "[ERROR] %s:%d %s(): buffer differ\n";
        uVar8 = 0xb6;
      }
      else {
        __format = "[ERROR] %s:%d %s(): Used buffer has different index as sent one\n";
        uVar8 = 0xb3;
      }
    }
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          uVar8,"virtio_legacy_send_command");
  abort();
}

Assistant:

static void virtio_legacy_set_promiscuous(struct virtio_device* dev, bool on) {
	struct {
		struct virtio_net_ctrl_hdr hdr;
		uint8_t on;
		uint8_t ack;
	} __attribute__((__packed__)) cmd = {};
	static_assert(sizeof(cmd) == 4, "Size of command struct wrong");

	cmd.hdr.class = VIRTIO_NET_CTRL_RX;
	cmd.hdr.cmd = VIRTIO_NET_CTRL_RX_PROMISC;
	cmd.on = on ? 1 : 0;

	virtio_legacy_send_command(dev, &cmd, sizeof(cmd));
	info("Set promisc to %u", on);
}